

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_test.cc
# Opt level: O3

FieldDescriptor * __thiscall
google::protobuf::anon_unknown_0::NoFieldPresenceSwapFieldTest::FindFieldByName
          (NoFieldPresenceSwapFieldTest *this,string_view field_name)

{
  FieldDescriptor *pFVar1;
  FieldDescriptor *pFVar2;
  
  pFVar1 = Descriptor::FindFieldByName(this->d1_,field_name);
  pFVar2 = Descriptor::FindFieldByName(this->d2_,field_name);
  if (pFVar1 == pFVar2) {
    return pFVar1;
  }
  protobuf::_GLOBAL__N_1::NoFieldPresenceSwapFieldTest::FindFieldByName();
}

Assistant:

const FieldDescriptor* FindFieldByName(absl::string_view field_name) {
    const FieldDescriptor* f1 = d1_->FindFieldByName(field_name);
    const FieldDescriptor* f2 = d2_->FindFieldByName(field_name);

    // We actually ensure uniqueness of *field descriptors* even if we try to
    // obtain them from different *message descriptors*.
    ABSL_CHECK_EQ(f1, f2);
    return f1;
  }